

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int inflateGetDictionary(z_streamp strm,Bytef *dictionary,uInt *dictLength)

{
  uint uVar1;
  internal_state *piVar2;
  int iVar3;
  int iVar4;
  ulong __n;
  
  iVar3 = inflateStateCheck(strm);
  iVar4 = -2;
  if (iVar3 == 0) {
    piVar2 = strm->state;
    iVar4 = (int)piVar2->gzindex;
    if (dictionary != (Bytef *)0x0 && iVar4 != 0) {
      uVar1 = *(uint *)((long)&piVar2->gzindex + 4);
      memcpy(dictionary,(void *)((ulong)uVar1 + *(long *)&piVar2->method),(ulong)(iVar4 - uVar1));
      __n = (ulong)*(uint *)((long)&piVar2->gzindex + 4);
      memcpy(dictionary + ((uint)piVar2->gzindex - __n),*(void **)&piVar2->method,__n);
    }
    iVar4 = 0;
    if (dictLength != (uInt *)0x0) {
      *dictLength = (uInt)piVar2->gzindex;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int ZEXPORT inflateGetDictionary(strm, dictionary, dictLength)
z_streamp strm;
Bytef *dictionary;
uInt *dictLength;
{
    struct inflate_state FAR *state;

    /* check state */
    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;

    /* copy dictionary */
    if (state->whave && dictionary != Z_NULL) {
        zmemcpy(dictionary, state->window + state->wnext,
                state->whave - state->wnext);
        zmemcpy(dictionary + state->whave - state->wnext,
                state->window, state->wnext);
    }
    if (dictLength != Z_NULL)
        *dictLength = state->whave;
    return Z_OK;
}